

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int httpserver_listen(httpserver_option_t option)

{
  int iVar1;
  uint uVar2;
  nh_server_t *server;
  ushort uVar3;
  ulong uVar4;
  epoll_event *peVar5;
  _func_void_http_context_t_ptr *in_stack_00000008;
  undefined1 local_34 [8];
  epoll_event ev_list [1];
  
  server = (nh_server_t *)malloc(0x30);
  if (server != (nh_server_t *)0x0) {
    server->handler = nh_server_events_cb;
    uVar3 = 10;
    if ((ushort)option.handler != 0) {
      uVar3 = (ushort)option.handler;
    }
    server->request_handler = in_stack_00000008;
    server->timeout = uVar3;
    if (uVar3 <= option.handler._2_2_) {
      uVar3 = option.handler._2_2_;
    }
    server->keep_alive_timeout = uVar3;
    iVar1 = epoll_create1(0);
    server->loop = iVar1;
    nh_server_listen(server,(char *)option._8_8_,(int)option.ip_addr);
    iVar1 = server->loop;
    while( true ) {
      uVar2 = epoll_wait(iVar1,(epoll_event *)local_34,1,-1);
      if ((int)uVar2 < 0) break;
      if (uVar2 != 0) {
        uVar4 = (ulong)uVar2;
        peVar5 = (epoll_event *)local_34;
        do {
          (*(code *)**(undefined8 **)&peVar5->field_0x4)(peVar5);
          peVar5 = (epoll_event *)((long)&peVar5->data + 4);
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      iVar1 = server->loop;
    }
    return 0;
  }
  __assert_fail("server != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                ,0x36d,"int httpserver_listen(httpserver_option_t)");
}

Assistant:

int httpserver_listen(httpserver_option_t option) {
    nh_server_t *server = (nh_server_t *) malloc(sizeof(nh_server_t));
    assert(server != NULL);
    server->handler = nh_server_events_cb;
    server->request_handler = option.handler;
    server->timeout = option.timeout > 0 ? option.timeout : DEFAULT_TIMEOUT;
    server->keep_alive_timeout = MAX(server->timeout, option.keep_alive_timeout);
    server->loop = epoll_create1(0);

    nh_server_listen(server, option.ip_addr, option.port);

    struct epoll_event ev_list[1];
    int events;
    while ((events = epoll_wait(server->loop, ev_list, 1, -1)) > -1) {
        for (int i = 0; i < events; i++) {
            ev_cb_t *ev_cb = (ev_cb_t *) ev_list[i].data.ptr;
            ev_cb->handler(&ev_list[i]);
        }
    }
    return 0;
}